

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

bool __thiscall ccs::CcsContext::getBool(CcsContext *this,string *propertyName)

{
  int iVar1;
  CcsProperty *pCVar2;
  no_such_property *this_00;
  __shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  pCVar2 = getProperty(this,propertyName);
  iVar1 = (*pCVar2->_vptr_CcsProperty[2])(pCVar2);
  if ((char)iVar1 != '\0') {
    iVar1 = (*pCVar2->_vptr_CcsProperty[7])(pCVar2);
    return SUB41(iVar1,0);
  }
  this_00 = (no_such_property *)__cxa_allocate_exception(0x38);
  std::__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,(__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> *)this);
  no_such_property::no_such_property(this_00,propertyName,(CcsContext *)&_Stack_38);
  __cxa_throw(this_00,&no_such_property::typeinfo,no_such_property::~no_such_property);
}

Assistant:

bool CcsContext::getBool(const std::string &propertyName) const {
  const CcsProperty &prop(getProperty(propertyName));
  if (!prop.exists()) throw no_such_property(propertyName, *this);
  return prop.boolValue();
}